

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

bool __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToJitExecutionMode
          (FunctionExecutionStateMachine *this)

{
  ExecutionMode executionMode;
  ExecutionMode EVar1;
  FunctionExecutionStateMachine *pFVar2;
  bool bVar3;
  
  executionMode = StateToMode(this,this->executionState);
  VerifyExecutionMode(this,executionMode);
  pFVar2 = this;
  TryTransitionToNextExecutionMode(this);
  EVar1 = StateToMode(pFVar2,this->executionState);
  pFVar2 = this;
  VerifyExecutionMode(this,EVar1);
  if (EVar1 == SimpleJit) {
LAB_0078bf91:
    EVar1 = StateToMode(pFVar2,this->executionState);
    VerifyExecutionMode(this,EVar1);
    bVar3 = true;
    if (EVar1 != executionMode) {
      FunctionBody::TraceExecutionMode((this->owner).ptr,(char *)0x0);
    }
  }
  else {
    if (EVar1 == FullJit) {
      if (this->fullJitRequeueThreshold == 0) goto LAB_0078bf91;
      this->fullJitRequeueThreshold = this->fullJitRequeueThreshold - 1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FunctionExecutionStateMachine::TryTransitionToJitExecutionMode()
    {
        const ExecutionMode previousExecutionMode = GetExecutionMode();

        TryTransitionToNextExecutionMode();
        switch (GetExecutionMode())
        {
        case ExecutionMode::SimpleJit:
            break;

        case ExecutionMode::FullJit:
            if (fullJitRequeueThreshold == 0)
            {
                break;
            }
            --fullJitRequeueThreshold;
            return false;

        default:
            return false;
        }

        if (GetExecutionMode() != previousExecutionMode)
        {
            owner->TraceExecutionMode();
        }
        return true;
    }